

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::BerkeleyRODatabase::Open(BerkeleyRODatabase *this)

{
  vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
  *this_00;
  __index_type _Var1;
  undefined4 uVar2;
  long lVar3;
  pointer pvVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  FILE *pFVar8;
  int64_t iVar9;
  runtime_error *prVar10;
  reference pvVar11;
  variant_alternative_t<0UL,_variant<DataRecord,_OverflowRecord>_> *pvVar12;
  uint uVar13;
  pointer pvVar14;
  uint32_t uVar15;
  InternalRecord *rec;
  long in_FS_OFFSET;
  initializer_list<unsigned_int> __l;
  allocator_type local_64a;
  allocator_type local_649;
  vector<std::byte,_std::allocator<std::byte>_> data;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pages;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_5f8;
  AutoFile local_5d8;
  OverflowPage opage;
  PageHeader opage_header;
  RecordsPage rec_page;
  PageHeader header_1;
  RecordsPage page;
  PageHeader header;
  MetaPage inner_meta;
  MetaPage outer_meta;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar8 = fsbridge::fopen((char *)&this->m_filepath,"rb");
  local_5d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.m_file = (FILE *)pFVar8;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_5f8);
  if (pFVar8 == (FILE *)0x0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"BerkeleyRODatabase: Failed to open database file");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    outer_meta.expected_page_num = 0;
    MetaPage::Unserialize<AutoFile>(&outer_meta,&local_5d8);
    AutoFile::seek(&local_5d8,0,2);
    iVar9 = AutoFile::tell(&local_5d8);
    if (outer_meta.last_page == (int)(iVar9 / (long)(ulong)outer_meta.pagesize) - 1U) {
      if (outer_meta.encrypt_algo == '\0') {
        uVar13 = 0;
        do {
          if (outer_meta.last_page <= uVar13) {
            SeekToPage(&local_5d8,outer_meta.root,outer_meta.pagesize);
            header.expected_page_num = outer_meta.root;
            header.other_endian = outer_meta.other_endian;
            PageHeader::Unserialize<AutoFile>(&header,&local_5d8);
            if (header.type == BTREE_LEAF) {
              if (header.entries == 2) {
                page.m_header.other_endian = header.other_endian;
                page.m_header._33_3_ = header._33_3_;
                page.m_header.type = 5;
                page.m_header.level = header.level;
                page.m_header._26_2_ = header._26_2_;
                page.m_header.expected_page_num = header.expected_page_num;
                page.m_header.lsn_file = header.lsn_file;
                page.m_header.lsn_offset = header.lsn_offset;
                page.m_header.page_num = header.page_num;
                page.m_header.prev_page = header.prev_page;
                page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                page.records.
                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                page.records.
                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                page.records.
                super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                RecordsPage::Unserialize<AutoFile>(&page,&local_5d8);
                this_00 = &page.records;
                pvVar11 = std::
                          vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                          ::at(this_00,0);
                if ((pvVar11->super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                    super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                    super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                    super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                    super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                    super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                    _M_index == '\0') {
                  pvVar11 = std::
                            vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ::at(this_00,0);
                  pvVar12 = std::get<0ul,wallet::DataRecord,wallet::OverflowRecord>(pvVar11);
                  bVar5 = std::operator==(&pvVar12->data,
                                          (vector<std::byte,_std::allocator<std::byte>_> *)
                                          SUBDATABASE_NAME);
                  if (!bVar5) goto LAB_001ca676;
                  pvVar11 = std::
                            vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                            ::at(this_00,1);
                  if ((pvVar11->super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                      super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                      super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                      super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                      super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                      super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                      _M_index == '\0') {
                    pvVar11 = std::
                              vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                              ::at(this_00,1);
                    pvVar12 = std::get<0ul,wallet::DataRecord,wallet::OverflowRecord>(pvVar11);
                    if ((pvVar12->m_header).len == 4) {
                      pvVar11 = std::
                                vector<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                                ::at(this_00,1);
                      pvVar12 = std::get<0ul,wallet::DataRecord,wallet::OverflowRecord>(pvVar11);
                      uVar2 = *(undefined4 *)
                               (pvVar12->data).
                               super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      uVar13 = (uint)uVar2 >> 0x18 | (uint)(uVar2 & 0xff0000) >> 8 |
                               (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
                      if (outer_meta.last_page < uVar13) {
                        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  (prVar10,"Page number is greater than database last page");
                        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
                          __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        goto LAB_001caace;
                      }
                      SeekToPage(&local_5d8,uVar13,outer_meta.pagesize);
                      inner_meta.expected_page_num = uVar13;
                      MetaPage::Unserialize<AutoFile>(&inner_meta,&local_5d8);
                      if (inner_meta.pagesize == outer_meta.pagesize) {
                        if (outer_meta.last_page < inner_meta.last_page) {
                          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar10,
                                     "Subdatabase last page is greater than database last page");
                        }
                        else {
                          if (inner_meta.encrypt_algo == '\0') {
                            rec_page.m_header.lsn_file = inner_meta.root;
                            __l._M_len = 1;
                            __l._M_array = (iterator)&rec_page;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                      (&pages,__l,(allocator_type *)&opage);
                            goto LAB_001ca1c9;
                          }
                          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (prVar10,"BDB builtin encryption is not supported");
                        }
                      }
                      else {
                        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(prVar10,"Unexpected page size");
                      }
                      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
                        __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      goto LAB_001caace;
                    }
                  }
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar10,"Subdatabase page number has unexpected length");
                }
                else {
LAB_001ca676:
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar10,"Subdatabase has an unexpected name");
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
                  __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_001caace;
              }
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar10,"Unexpected number of entries in outer database root page");
            }
            else {
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar10,"Unexpected outer database root page type");
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_001caace;
          }
          SeekToPage(&local_5d8,uVar13,outer_meta.pagesize);
          uVar6 = ser_readdata32<AutoFile>(&local_5d8);
          uVar7 = ser_readdata32<AutoFile>(&local_5d8);
          uVar15 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          if (outer_meta.other_endian == false) {
            uVar15 = uVar7;
          }
          uVar7 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          if (outer_meta.other_endian == false) {
            uVar7 = uVar6;
          }
        } while ((uVar7 == 0) && (uVar13 = uVar13 + 1, uVar15 == 1));
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar10,
                   "LSNs are not reset, this database is not completely flushed. Please reopen then close the database with a version that has BDB support"
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001caace;
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"BDB builtin encryption is not supported");
    }
    else {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"Last page number could not fit in file");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  goto LAB_001caace;
LAB_001ca1c9:
  if (pages.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      pages.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar15 = pages.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    pages.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         pages.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    SeekToPage(&local_5d8,uVar15,outer_meta.pagesize);
    header_1.other_endian = inner_meta.other_endian;
    header_1.expected_page_num = uVar15;
    PageHeader::Unserialize<AutoFile>(&header_1,&local_5d8);
    if (header_1.type == BTREE_INTERNAL) {
      rec_page.m_header.other_endian = header_1.other_endian;
      rec_page.m_header._33_3_ = header_1._33_3_;
      rec_page.m_header.type = 3;
      rec_page.m_header.level = header_1.level;
      rec_page.m_header._26_2_ = header_1._26_2_;
      rec_page.m_header.expected_page_num = header_1.expected_page_num;
      rec_page.m_header.next_page = header_1.next_page;
      rec_page.m_header.entries = header_1.entries;
      rec_page.m_header.hf_offset = header_1.hf_offset;
      rec_page.m_header.lsn_file = header_1.lsn_file;
      rec_page.m_header.lsn_offset = header_1.lsn_offset;
      rec_page.m_header.page_num = header_1.page_num;
      rec_page.m_header.prev_page = header_1.prev_page;
      rec_page.records.
      super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      rec_page.records.
      super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rec_page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rec_page.records.
      super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      rec_page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rec_page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      InternalPage::Unserialize<AutoFile>((InternalPage *)&rec_page,&local_5d8);
      pvVar4 = rec_page.records.
               super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar14 = rec_page.records.
                     super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar4;
          pvVar14 = pvVar14 + 1) {
        if (*(char *)((long)&(pvVar14->
                             super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                             super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                             super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                             super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                             super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                             super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                             ._M_u + 3) == '\0') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&pages,(value_type_conflict3 *)
                            ((long)&(pvVar14->
                                    super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>)
                                    .
                                    super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                    .
                                    super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                    .
                                    super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                    .
                                    super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                    .
                                    super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                    ._M_u + 8));
        }
      }
      InternalPage::~InternalPage((InternalPage *)&rec_page);
    }
    else {
      if (header_1.type != BTREE_LEAF) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Unexpected page type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001caace;
      }
      rec_page.m_header.other_endian = header_1.other_endian;
      rec_page.m_header._33_3_ = header_1._33_3_;
      rec_page.m_header.type = 5;
      rec_page.m_header.level = header_1.level;
      rec_page.m_header._26_2_ = header_1._26_2_;
      rec_page.m_header.expected_page_num = header_1.expected_page_num;
      rec_page.m_header.next_page = header_1.next_page;
      rec_page.m_header.entries = header_1.entries;
      rec_page.m_header.hf_offset = header_1.hf_offset;
      rec_page.m_header.lsn_file = header_1.lsn_file;
      rec_page.m_header.lsn_offset = header_1.lsn_offset;
      rec_page.m_header.page_num = header_1.page_num;
      rec_page.m_header.prev_page = header_1.prev_page;
      rec_page.records.
      super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      rec_page.records.
      super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rec_page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rec_page.records.
      super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      rec_page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rec_page.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      RecordsPage::Unserialize<AutoFile>(&rec_page,&local_5d8);
      pvVar4 = rec_page.records.
               super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((((long)rec_page.records.
                  super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)rec_page.records.
                 super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x28 & 1U) != 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"Records page has odd number of records");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001caace;
      }
      key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar5 = true;
      for (pvVar14 = rec_page.records.
                     super__Vector_base<std::variant<wallet::DataRecord,_wallet::OverflowRecord>,_std::allocator<std::variant<wallet::DataRecord,_wallet::OverflowRecord>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar4;
          pvVar14 = pvVar14 + 1) {
        data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pvVar14 == (pointer)0x0) {
LAB_001ca2f8:
          if (bVar5) {
            std::vector<std::byte,_std::allocator<std::byte>_>::operator=(&key,&data);
          }
          else {
            std::vector<std::byte,zero_after_free_allocator<std::byte>>::
            vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                      ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&opage,
                       (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                        )key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                        )key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_649);
            std::vector<std::byte,zero_after_free_allocator<std::byte>>::
            vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                      ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&opage_header,
                       (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                        )data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                        )data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_64a);
            std::
            _Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
            ::
            _M_emplace_unique<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>>
                      ((_Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                        *)&this->m_records,
                       (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&opage,
                       (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&opage_header);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       &opage_header);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&opage);
            if (key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) {
              key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        else {
          _Var1 = (pvVar14->super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                  super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                  super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                  super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                  super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                  super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>._M_index;
          if (_Var1 != '\x01') {
            if (_Var1 == '\0') {
              if (*(char *)((long)&(pvVar14->
                                   super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                                   super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                   .
                                   super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                   .
                                   super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                   .
                                   super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                   .
                                   super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                   ._M_u + 3) != '\0') goto LAB_001ca3aa;
              std::vector<std::byte,_std::allocator<std::byte>_>::operator=
                        (&data,(vector<std::byte,_std::allocator<std::byte>_> *)
                               ((long)&(pvVar14->
                                       super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>
                                       ).
                                       super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                       .
                                       super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                       .
                                       super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                       .
                                       super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                       .
                                       super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                                       ._M_u + 8));
            }
            goto LAB_001ca2f8;
          }
          if (*(char *)((long)&(pvVar14->
                               super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                               super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                               super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                               super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                               super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                               super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                               ._M_u + 3) == '\0') {
            uVar15 = *(uint32_t *)
                      ((long)&(pvVar14->
                              super__Variant_base<wallet::DataRecord,_wallet::OverflowRecord>).
                              super__Move_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                              super__Copy_assign_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                              super__Move_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                              super__Copy_ctor_alias<wallet::DataRecord,_wallet::OverflowRecord>.
                              super__Variant_storage_alias<wallet::DataRecord,_wallet::OverflowRecord>
                              ._M_u + 8);
            while (uVar15 != 0) {
              SeekToPage(&local_5d8,uVar15,outer_meta.pagesize);
              opage_header.other_endian = inner_meta.other_endian;
              opage_header.expected_page_num = uVar15;
              PageHeader::Unserialize<AutoFile>(&opage_header,&local_5d8);
              if (opage_header.type != OVERFLOW_DATA) {
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar10,"Bad overflow record page type");
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
                  __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_001caace;
              }
              opage.m_header.other_endian = opage_header.other_endian;
              opage.m_header._33_3_ = opage_header._33_3_;
              opage.m_header.type = 7;
              opage.m_header.level = opage_header.level;
              opage.m_header._26_2_ = opage_header._26_2_;
              opage.m_header.expected_page_num = opage_header.expected_page_num;
              opage.m_header.lsn_file = opage_header.lsn_file;
              opage.m_header.lsn_offset = opage_header.lsn_offset;
              opage.m_header.page_num = opage_header.page_num;
              opage.m_header.prev_page = opage_header.prev_page;
              opage.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              opage.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              opage.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              OverflowPage::Unserialize<AutoFile>(&opage,&local_5d8);
              std::vector<std::byte,std::allocator<std::byte>>::
              insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
                        ((vector<std::byte,std::allocator<std::byte>> *)&data,
                         (const_iterator)
                         data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                          )opage.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                          )opage.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
              uVar15 = opage_header.next_page;
              std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                        (&opage.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
            }
            goto LAB_001ca2f8;
          }
        }
LAB_001ca3aa:
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&data.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      }
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      RecordsPage::~RecordsPage(&rec_page);
    }
    goto LAB_001ca1c9;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&pages.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  RecordsPage::~RecordsPage(&page);
  AutoFile::~AutoFile(&local_5d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
LAB_001caace:
  __stack_chk_fail();
}

Assistant:

void BerkeleyRODatabase::Open()
{
    // Open the file
    FILE* file = fsbridge::fopen(m_filepath, "rb");
    AutoFile db_file(file);
    if (db_file.IsNull()) {
        throw std::runtime_error("BerkeleyRODatabase: Failed to open database file");
    }

    uint32_t page_size = 4096; // Default page size

    // Read the outer metapage
    // Expected page number is 0
    MetaPage outer_meta(0);
    db_file >> outer_meta;
    page_size = outer_meta.pagesize;

    // Verify the size of the file is a multiple of the page size
    db_file.seek(0, SEEK_END);
    int64_t size = db_file.tell();

    // Since BDB stores everything in a page, the file size should be a multiple of the page size;
    // However, BDB doesn't actually check that this is the case, and enforcing this check results
    // in us rejecting a database that BDB would not, so this check needs to be excluded.
    // This is left commented out as a reminder to not accidentally implement this in the future.
    // if (size % page_size != 0) {
    //     throw std::runtime_error("File size is not a multiple of page size");
    // }

    // Check the last page number
    uint32_t expected_last_page{uint32_t((size / page_size) - 1)};
    if (outer_meta.last_page != expected_last_page) {
        throw std::runtime_error("Last page number could not fit in file");
    }

    // Make sure encryption is disabled
    if (outer_meta.encrypt_algo != 0) {
        throw std::runtime_error("BDB builtin encryption is not supported");
    }

    // Check all Log Sequence Numbers (LSN) point to file 0 and offset 1 which indicates that the LSNs were
    // reset and that the log files are not necessary to get all of the data in the database.
    for (uint32_t i = 0; i < outer_meta.last_page; ++i) {
        // The LSN is composed of 2 32-bit ints, the first is a file id, the second an offset
        // It will always be the first 8 bytes of a page, so we deserialize it directly for every page
        uint32_t file;
        uint32_t offset;
        SeekToPage(db_file, i, page_size);
        db_file >> file >> offset;
        if (outer_meta.other_endian) {
            file = internal_bswap_32(file);
            offset = internal_bswap_32(offset);
        }
        if (file != 0 || offset != 1) {
            throw std::runtime_error("LSNs are not reset, this database is not completely flushed. Please reopen then close the database with a version that has BDB support");
        }
    }

    // Read the root page
    SeekToPage(db_file, outer_meta.root, page_size);
    PageHeader header(outer_meta.root, outer_meta.other_endian);
    db_file >> header;
    if (header.type != PageType::BTREE_LEAF) {
        throw std::runtime_error("Unexpected outer database root page type");
    }
    if (header.entries != 2) {
        throw std::runtime_error("Unexpected number of entries in outer database root page");
    }
    RecordsPage page(header);
    db_file >> page;

    // First record should be the string "main"
    if (!std::holds_alternative<DataRecord>(page.records.at(0)) || std::get<DataRecord>(page.records.at(0)).data != SUBDATABASE_NAME) {
        throw std::runtime_error("Subdatabase has an unexpected name");
    }
    // Check length of page number for subdatabase location
    if (!std::holds_alternative<DataRecord>(page.records.at(1)) || std::get<DataRecord>(page.records.at(1)).m_header.len != 4) {
        throw std::runtime_error("Subdatabase page number has unexpected length");
    }

    // Read subdatabase page number
    // It is written as a big endian 32 bit number
    uint32_t main_db_page = ReadBE32(UCharCast(std::get<DataRecord>(page.records.at(1)).data.data()));

    // The main database is in a page that doesn't exist
    if (main_db_page > outer_meta.last_page) {
        throw std::runtime_error("Page number is greater than database last page");
    }

    // Read the inner metapage
    SeekToPage(db_file, main_db_page, page_size);
    MetaPage inner_meta(main_db_page);
    db_file >> inner_meta;

    if (inner_meta.pagesize != page_size) {
        throw std::runtime_error("Unexpected page size");
    }

    if (inner_meta.last_page > outer_meta.last_page) {
        throw std::runtime_error("Subdatabase last page is greater than database last page");
    }

    // Make sure encryption is disabled
    if (inner_meta.encrypt_algo != 0) {
        throw std::runtime_error("BDB builtin encryption is not supported");
    }

    // Do a DFS through the BTree, starting at root
    std::vector<uint32_t> pages{inner_meta.root};
    while (pages.size() > 0) {
        uint32_t curr_page = pages.back();
        // It turns out BDB completely ignores this last_page field and doesn't actually update it to the correct
        // last page. While we should be checking this, we can't.
        // This is left commented out as a reminder to not accidentally implement this in the future.
        // if (curr_page > inner_meta.last_page) {
        //     throw std::runtime_error("Page number is greater than subdatabase last page");
        // }
        pages.pop_back();
        SeekToPage(db_file, curr_page, page_size);
        PageHeader header(curr_page, inner_meta.other_endian);
        db_file >> header;
        switch (header.type) {
        case PageType::BTREE_INTERNAL: {
            InternalPage int_page(header);
            db_file >> int_page;
            for (const InternalRecord& rec : int_page.records) {
                if (rec.m_header.deleted) continue;
                pages.push_back(rec.page_num);
            }
            break;
        }
        case PageType::BTREE_LEAF: {
            RecordsPage rec_page(header);
            db_file >> rec_page;
            if (rec_page.records.size() % 2 != 0) {
                // BDB stores key value pairs in consecutive records, thus an odd number of records is unexpected
                throw std::runtime_error("Records page has odd number of records");
            }
            bool is_key = true;
            std::vector<std::byte> key;
            for (const std::variant<DataRecord, OverflowRecord>& rec : rec_page.records) {
                std::vector<std::byte> data;
                if (const DataRecord* drec = std::get_if<DataRecord>(&rec)) {
                    if (drec->m_header.deleted) continue;
                    data = drec->data;
                } else if (const OverflowRecord* orec = std::get_if<OverflowRecord>(&rec)) {
                    if (orec->m_header.deleted) continue;
                    uint32_t next_page = orec->page_number;
                    while (next_page != 0) {
                        SeekToPage(db_file, next_page, page_size);
                        PageHeader opage_header(next_page, inner_meta.other_endian);
                        db_file >> opage_header;
                        if (opage_header.type != PageType::OVERFLOW_DATA) {
                            throw std::runtime_error("Bad overflow record page type");
                        }
                        OverflowPage opage(opage_header);
                        db_file >> opage;
                        data.insert(data.end(), opage.data.begin(), opage.data.end());
                        next_page = opage_header.next_page;
                    }
                }

                if (is_key) {
                    key = data;
                } else {
                    m_records.emplace(SerializeData{key.begin(), key.end()}, SerializeData{data.begin(), data.end()});
                    key.clear();
                }
                is_key = !is_key;
            }
            break;
        }
        default:
            throw std::runtime_error("Unexpected page type");
        }
    }
}